

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O1

HRESULT __thiscall
Js::SCACore::Deserializer::SetTransferableVars(Deserializer *this,Var *vars,size_t count)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  
  if (this->m_transferableVars == (Var *)0x0) {
    HVar3 = 0;
    if (count != 0) {
      HVar3 = ValidateTransferableVars(vars,count);
      if (HVar3 == 0) {
        this->m_transferableVars = vars;
        this->m_cTransferableVars = count;
        HVar3 = 0;
      }
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCACore.cpp"
                                ,0x73,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    HVar3 = -0x7fffbffb;
  }
  return HVar3;
}

Assistant:

HRESULT Deserializer::SetTransferableVars(Var *vars, size_t count)
        {
            if (m_transferableVars != nullptr)
            {
                Assert(false);
                return E_FAIL;
            }
            else if (count > 0)
            {
                HRESULT hr = ValidateTransferableVars(vars, count);
                if (hr != S_OK)
                {
                    return hr;
                }
                m_transferableVars = vars;
                m_cTransferableVars = count;
            }
            return S_OK;
        }